

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtins.c
# Opt level: O2

int do_device(int nargs,char **args)

{
  char cVar1;
  char *__s;
  int iVar2;
  mode_t perm;
  uint uid;
  uint gid;
  size_t sVar3;
  int iVar4;
  
  if (nargs == 5) {
    __s = args[1];
    sVar3 = strlen(__s);
    iVar2 = (int)sVar3 + -1;
    iVar4 = 0;
    cVar1 = __s[iVar2];
    if (cVar1 == '*') {
      __s[iVar2] = '\0';
    }
    perm = get_mode(args[2]);
    uid = decode_uid(args[3]);
    gid = decode_uid(args[4]);
    add_devperms_partners(__s,perm,uid,gid,(ushort)(cVar1 == '*'));
  }
  else {
    iVar4 = -1;
  }
  return iVar4;
}

Assistant:

int do_device(int nargs, char **args) {
    int len;
    char tmp[64];
    char *source = args[1];
    int prefix = 0;

    if (nargs != 5)
        return -1;
    /* Check for wildcard '*' at the end which indicates a prefix. */
    len = strlen(args[1]) - 1;
    if (args[1][len] == '*') {
        args[1][len] = '\0';
        prefix = 1;
    }
    /* If path starts with mtd@ lookup the mount number. */
    /*if (!strncmp(source, "mtd@", 4)) {
        int n = mtd_name_to_number(source + 4);
        if (n >= 0) {
            snprintf(tmp, sizeof(tmp), "/dev/mtd/mtd%d", n);
            source = tmp;
        }
    }*/
    add_devperms_partners(source, get_mode(args[2]), decode_uid(args[3]),
                          decode_uid(args[4]), prefix);
    return 0;
}